

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_reader.hpp
# Opt level: O0

void __thiscall
pstore::http::
buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>_>
::check_invariants(buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
                   *this)

{
  bool bVar1;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_38;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_28;
  anon_class_8_1_8991fb9c local_18;
  anon_class_8_1_8991fb9c is_valid;
  buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
  *this_local;
  
  local_18.this = this;
  is_valid.this = this;
  bVar1 = pstore::gsl::details::operator<=(&this->pos_,&this->end_);
  if (!bVar1) {
    assert_failed("pos_ <= end_",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/http/buffered_reader.hpp"
                  ,0x15b);
  }
  pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
            (&local_28,&this->pos_);
  bVar1 = check_invariants::anon_class_8_1_8991fb9c::operator()(&local_18,&local_28);
  if (!bVar1) {
    assert_failed("is_valid (pos_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/http/buffered_reader.hpp"
                  ,0x15c);
  }
  pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
            (&local_38,&this->end_);
  bVar1 = check_invariants::anon_class_8_1_8991fb9c::operator()(&local_18,&local_38);
  if (!bVar1) {
    assert_failed("is_valid (end_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/http/buffered_reader.hpp"
                  ,0x15d);
  }
  return;
}

Assistant:

void buffered_reader<IO, RefillFunction>::check_invariants () noexcept {
#ifndef NDEBUG
            auto is_valid = [this] (gsl::span<std::uint8_t>::iterator it) noexcept {
                ptrdiff_t const p = this->pos (it);
                return p >= 0 &&
                       static_cast<std::make_unsigned<ptrdiff_t>::type> (p) <= buf_.size ();
            };
            PSTORE_ASSERT (pos_ <= end_);
            PSTORE_ASSERT (is_valid (pos_));
            PSTORE_ASSERT (is_valid (end_));
#endif
        }